

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLoader.cpp
# Opt level: O0

void __thiscall COLLADASaxFWL::Loader::~Loader(Loader *this)

{
  long *plVar1;
  bool bVar2;
  pointer ppVar3;
  KinematicsIntermediateData *in_RDI;
  AnimationList *animationList;
  const_iterator it;
  AnimationList *in_stack_ffffffffffffffb8;
  AnimationList *in_stack_ffffffffffffffd0;
  iterator local_28;
  _Rb_tree_const_iterator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*>_>
  local_20;
  iterator local_18;
  _Rb_tree_const_iterator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*>_>
  local_10 [2];
  
  in_RDI->_vptr_KinematicsIntermediateData = (_func_int **)&PTR__Loader_00db3e48;
  plVar1 = (long *)in_RDI[1].mKinematicsScenes.
                   super_unordered_map<COLLADABU::URI,_COLLADASaxFWL::KinematicsScene_*,_std::tr1::hash<COLLADABU::URI>,_std::equal_to<COLLADABU::URI>,_std::allocator<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsScene_*>_>_>
                   .
                   super___unordered_map<COLLADABU::URI,_COLLADASaxFWL::KinematicsScene_*,_std::tr1::hash<COLLADABU::URI>,_std::equal_to<COLLADABU::URI>,_std::allocator<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsScene_*>_>,_false>
                   .
                   super__Hashtable<COLLADABU::URI,_std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsScene_*>,_std::allocator<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsScene_*>_>,_std::_Select1st<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsScene_*>_>,_std::equal_to<COLLADABU::URI>,_std::tr1::hash<COLLADABU::URI>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                   ._M_element_count;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  deleteVectorFW<COLLADAFW::VisualScene*>
            ((vector<COLLADAFW::VisualScene_*,_std::allocator<COLLADAFW::VisualScene_*>_> *)
             in_stack_ffffffffffffffd0);
  deleteVectorFW<COLLADAFW::LibraryNodes*>
            ((vector<COLLADAFW::LibraryNodes_*,_std::allocator<COLLADAFW::LibraryNodes_*>_> *)
             in_stack_ffffffffffffffd0);
  deleteVectorFW<COLLADAFW::Effect*>
            ((vector<COLLADAFW::Effect_*,_std::allocator<COLLADAFW::Effect_*>_> *)
             in_stack_ffffffffffffffd0);
  deleteVectorFW<COLLADAFW::Light*>
            ((vector<COLLADAFW::Light_*,_std::allocator<COLLADAFW::Light_*>_> *)
             in_stack_ffffffffffffffd0);
  deleteVectorFW<COLLADAFW::Camera*>
            ((vector<COLLADAFW::Camera_*,_std::allocator<COLLADAFW::Camera_*>_> *)
             in_stack_ffffffffffffffd0);
  local_18._M_node =
       (_Base_ptr)
       std::
       map<COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*>_>_>
       ::begin((map<COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*>_>_>
                *)in_stack_ffffffffffffffb8);
  std::_Rb_tree_const_iterator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*>_>::
  _Rb_tree_const_iterator(local_10,&local_18);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*>_>_>
         ::end((map<COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*>_>_>
                *)in_stack_ffffffffffffffb8);
    std::_Rb_tree_const_iterator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*>_>
    ::_Rb_tree_const_iterator(&local_20,&local_28);
    bVar2 = std::operator!=(local_10,&local_20);
    if (!bVar2) break;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*>_>
                           *)in_RDI);
    in_stack_ffffffffffffffb8 = ppVar3->second;
    in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffb8;
    if (in_stack_ffffffffffffffb8 != (AnimationList *)0x0) {
      (*(in_stack_ffffffffffffffb8->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1000>).
        super_Object._vptr_Object[1])();
    }
    std::_Rb_tree_const_iterator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*>_>
                  *)in_RDI);
  }
  std::
  vector<COLLADASaxFWL::Loader::AnimationSidAddressBinding,_std::allocator<COLLADASaxFWL::Loader::AnimationSidAddressBinding>_>
  ::~vector((vector<COLLADASaxFWL::Loader::AnimationSidAddressBinding,_std::allocator<COLLADASaxFWL::Loader::AnimationSidAddressBinding>_>
             *)in_stack_ffffffffffffffd0);
  std::
  map<COLLADAFW::UniqueId,_COLLADAFW::Formula_*,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_>_>
  ::~map((map<COLLADAFW::UniqueId,_COLLADAFW::Formula_*,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_>_>
          *)0x7748a8);
  KinematicsIntermediateData::~KinematicsIntermediateData(in_RDI);
  std::
  map<COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*>_>_>
  ::~map((map<COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::AnimationList_*>_>_>
          *)0x7748ca);
  std::
  set<COLLADAFW::SkinController,_bool_(*)(const_COLLADAFW::SkinController_&,_const_COLLADAFW::SkinController_&),_std::allocator<COLLADAFW::SkinController>_>
  ::~set((set<COLLADAFW::SkinController,_bool_(*)(const_COLLADAFW::SkinController_&,_const_COLLADAFW::SkinController_&),_std::allocator<COLLADAFW::SkinController>_>
          *)0x7748db);
  std::
  map<COLLADAFW::UniqueId,_COLLADABU::URI,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADABU::URI>_>_>
  ::~map((map<COLLADAFW::UniqueId,_COLLADABU::URI,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADABU::URI>_>_>
          *)0x7748ec);
  std::
  map<COLLADAFW::UniqueId,_std::__cxx11::list<COLLADASaxFWL::Loader::InstanceControllerData,_std::allocator<COLLADASaxFWL::Loader::InstanceControllerData>_>,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_std::__cxx11::list<COLLADASaxFWL::Loader::InstanceControllerData,_std::allocator<COLLADASaxFWL::Loader::InstanceControllerData>_>_>_>_>
  ::~map((map<COLLADAFW::UniqueId,_std::__cxx11::list<COLLADASaxFWL::Loader::InstanceControllerData,_std::allocator<COLLADASaxFWL::Loader::InstanceControllerData>_>,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_std::__cxx11::list<COLLADASaxFWL::Loader::InstanceControllerData,_std::allocator<COLLADASaxFWL::Loader::InstanceControllerData>_>_>_>_>
          *)0x7748fd);
  std::
  map<COLLADAFW::UniqueId,_COLLADASaxFWL::Loader::JointSidsOrIds,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADASaxFWL::Loader::JointSidsOrIds>_>_>
  ::~map((map<COLLADAFW::UniqueId,_COLLADASaxFWL::Loader::JointSidsOrIds,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADASaxFWL::Loader::JointSidsOrIds>_>_>
          *)0x77490e);
  std::vector<COLLADAFW::MorphController_*,_std::allocator<COLLADAFW::MorphController_*>_>::~vector
            ((vector<COLLADAFW::MorphController_*,_std::allocator<COLLADAFW::MorphController_*>_> *)
             in_stack_ffffffffffffffd0);
  std::vector<COLLADAFW::Camera_*,_std::allocator<COLLADAFW::Camera_*>_>::~vector
            ((vector<COLLADAFW::Camera_*,_std::allocator<COLLADAFW::Camera_*>_> *)
             in_stack_ffffffffffffffd0);
  std::vector<COLLADAFW::Light_*,_std::allocator<COLLADAFW::Light_*>_>::~vector
            ((vector<COLLADAFW::Light_*,_std::allocator<COLLADAFW::Light_*>_> *)
             in_stack_ffffffffffffffd0);
  std::vector<COLLADAFW::Effect_*,_std::allocator<COLLADAFW::Effect_*>_>::~vector
            ((vector<COLLADAFW::Effect_*,_std::allocator<COLLADAFW::Effect_*>_> *)
             in_stack_ffffffffffffffd0);
  std::vector<COLLADAFW::LibraryNodes_*,_std::allocator<COLLADAFW::LibraryNodes_*>_>::~vector
            ((vector<COLLADAFW::LibraryNodes_*,_std::allocator<COLLADAFW::LibraryNodes_*>_> *)
             in_stack_ffffffffffffffd0);
  std::vector<COLLADAFW::VisualScene_*,_std::allocator<COLLADAFW::VisualScene_*>_>::~vector
            ((vector<COLLADAFW::VisualScene_*,_std::allocator<COLLADAFW::VisualScene_*>_> *)
             in_stack_ffffffffffffffd0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::SidTreeNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::SidTreeNode_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::SidTreeNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::SidTreeNode_*>_>_>
          *)0x774985);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *)0x774996);
  GeometryMaterialIdInfo::~GeometryMaterialIdInfo((GeometryMaterialIdInfo *)0x7749a7);
  std::
  map<unsigned_long,_COLLADABU::URI,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_COLLADABU::URI>_>_>
  ::~map((map<unsigned_long,_COLLADABU::URI,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_COLLADABU::URI>_>_>
          *)0x7749b8);
  COLLADABU::hash_map<COLLADABU::URI,_unsigned_long>::~hash_map
            ((hash_map<COLLADABU::URI,_unsigned_long> *)0x7749c9);
  COLLADABU::hash_map<COLLADABU::URI,_COLLADAFW::UniqueId>::~hash_map
            ((hash_map<COLLADABU::URI,_COLLADAFW::UniqueId> *)0x7749d7);
  std::
  vector<COLLADASaxFWL::IExtraDataCallbackHandler_*,_std::allocator<COLLADASaxFWL::IExtraDataCallbackHandler_*>_>
  ::~vector((vector<COLLADASaxFWL::IExtraDataCallbackHandler_*,_std::allocator<COLLADASaxFWL::IExtraDataCallbackHandler_*>_>
             *)in_stack_ffffffffffffffd0);
  COLLADAFW::LoaderUtils::~LoaderUtils((LoaderUtils *)0x7749f3);
  COLLADAFW::ILoader::~ILoader((ILoader *)in_RDI);
  return;
}

Assistant:

Loader::~Loader()
	{
		delete mSidTreeRoot;

		// delete visual scenes
		deleteVectorFW(mVisualScenes);

		// delete library nodes
		deleteVectorFW(mLibraryNodes);

		// delete effects
		deleteVectorFW(mEffects);

		// delete lights
		deleteVectorFW(mLights);

		// delete cameras
		deleteVectorFW(mCameras);

		// We do not delete formulas here. They are deleted by the Formulas class

		// delete animation lists
		Loader::UniqueIdAnimationListMap::const_iterator it = mUniqueIdAnimationListMap.begin();
		for ( ; it != mUniqueIdAnimationListMap.end(); ++it )
		{
			COLLADAFW::AnimationList* animationList = it->second;
			FW_DELETE animationList;
		}
	}